

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O2

lzma_outbuf * lzma_outq_get_buf(lzma_outq *outq)

{
  uint uVar1;
  uint uVar2;
  lzma_outbuf *plVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = outq->bufs_allocated;
  uVar2 = outq->bufs_used;
  if (uVar2 < uVar1) {
    plVar3 = outq->bufs;
    uVar4 = (ulong)outq->bufs_pos;
    uVar6 = outq->bufs_pos + 1;
    plVar3[uVar4].buf = outq->bufs_mem + uVar4 * outq->buf_size_max;
    plVar3[uVar4].size = 0;
    plVar3[uVar4].finished = false;
    uVar5 = 0;
    if (uVar6 != uVar1) {
      uVar5 = uVar6;
    }
    outq->bufs_pos = uVar5;
    outq->bufs_used = uVar2 + 1;
    return plVar3 + uVar4;
  }
  __assert_fail("outq->bufs_used < outq->bufs_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/outqueue.c"
                ,0x75,"lzma_outbuf *lzma_outq_get_buf(lzma_outq *)");
}

Assistant:

extern lzma_outbuf *
lzma_outq_get_buf(lzma_outq *outq)
{
	// Caller must have checked it with lzma_outq_has_buf().
	assert(outq->bufs_used < outq->bufs_allocated);

	// Initialize the new buffer.
	lzma_outbuf *buf = &outq->bufs[outq->bufs_pos];
	buf->buf = outq->bufs_mem + outq->bufs_pos * outq->buf_size_max;
	buf->size = 0;
	buf->finished = false;

	// Update the queue state.
	if (++outq->bufs_pos == outq->bufs_allocated)
		outq->bufs_pos = 0;

	++outq->bufs_used;

	return buf;
}